

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgd_optimizer.h
# Opt level: O0

void __thiscall yyml::nn::SGDOptimizer::Step(SGDOptimizer *this)

{
  Variable<double> *this_00;
  double *pdVar1;
  bool bVar2;
  vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_> *this_01;
  reference ppVVar3;
  size_t sVar4;
  ulong local_38;
  size_t i;
  Variable<double> *parameter;
  iterator __end2;
  iterator __begin2;
  vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_> *__range2;
  SGDOptimizer *this_local;
  
  this_01 = &(this->super_OptimizerInterface).parameters_;
  __end2 = std::vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
           ::begin(this_01);
  parameter = (Variable<double> *)
              std::
              vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>::
              end(this_01);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<yyml::nn::Variable<double>_**,_std::vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>_>
                                *)&parameter);
    if (!bVar2) break;
    ppVVar3 = __gnu_cxx::
              __normal_iterator<yyml::nn::Variable<double>_**,_std::vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>_>
              ::operator*(&__end2);
    this_00 = *ppVVar3;
    local_38 = 0;
    while( true ) {
      sVar4 = Tensor<double>::total(&this_00->values_);
      if (sVar4 <= local_38) break;
      pdVar1 = (this_00->values_).data_;
      pdVar1[local_38] =
           -this->learning_rate_ * (this_00->grads_).data_[local_38] + pdVar1[local_38];
      local_38 = local_38 + 1;
    }
    __gnu_cxx::
    __normal_iterator<yyml::nn::Variable<double>_**,_std::vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void Step() override {
    for (auto* parameter : parameters_) {
      for (size_t i = 0; i < parameter->values_.total(); i++) {
        parameter->values_.data_[i] -=
            learning_rate_ * parameter->grads_.data_[i];
      }
    }
  }